

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O3

void __thiscall clask::logger::~logger(logger *this)

{
  char cVar1;
  size_t sVar2;
  long *local_30;
  long local_20 [2];
  
  this->_vptr_logger = (_func_int **)&PTR__logger_00126a68;
  if (default_level <= (int)this->lv) {
    cVar1 = (char)this + '\b';
    std::ios::widen((char)*(undefined8 *)(*(long *)&this->os + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    if (local_30 == (long *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x128580);
    }
    else {
      sVar2 = strlen((char *)local_30);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(char *)local_30,sVar2);
    }
    if (local_30 != local_20) {
      operator_delete(local_30,local_20[0] + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->os);
  std::ios_base::~ios_base((ios_base *)&this->field_0x78);
  return;
}

Assistant:

inline logger::~logger() {
  if (lv >= logger::level()) {
    os << std::endl;
    std::cerr << os.str().c_str();
  }
}